

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

void __thiscall
flatbuffers::cpp::CppGenerator::GenMiniReflect
          (CppGenerator *this,StructDef *struct_def,EnumDef *enum_def)

{
  CodeWriter *pCVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  BaseType BVar4;
  pointer ppEVar5;
  pointer ppFVar6;
  FieldDef *pFVar7;
  EnumDef *pEVar8;
  pointer pcVar9;
  undefined8 uVar10;
  SymbolTable<flatbuffers::EnumVal> *pSVar11;
  SymbolTable<flatbuffers::EnumVal> *pSVar12;
  uint16_t uVar13;
  undefined6 uVar14;
  BaseType BVar15;
  _Alloc_hider __s2;
  size_type sVar16;
  EnumDef *this_00;
  pointer pbVar17;
  iterator iVar18;
  Type *pTVar19;
  int iVar20;
  mapped_type *pmVar21;
  char *pcVar22;
  size_t sVar23;
  long *plVar24;
  undefined8 *puVar25;
  EnumVal *pEVar26;
  uint64_t uVar27;
  long *plVar28;
  ulong *puVar29;
  size_type *psVar30;
  Value *__args;
  uint uVar31;
  char *__s;
  pointer pbVar32;
  ulong uVar33;
  undefined8 uVar34;
  pointer ppFVar35;
  Type *pTVar36;
  int t;
  FieldDef **field;
  unsigned_short *puVar37;
  StructDef *pSVar38;
  pointer ppEVar39;
  bool bVar40;
  string ts;
  string as;
  string rs;
  string vs;
  string ns;
  vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_> types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  type_refs;
  vector<unsigned_short,_std::allocator<unsigned_short>_> array_sizes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  _Alloc_hider local_4c8;
  undefined2 uStack_4c0;
  undefined6 uStack_4be;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4b8;
  string local_4a8;
  string local_488;
  ulong *local_468;
  long local_460;
  ulong local_458;
  long lStack_450;
  string local_448;
  allocator<char> local_421;
  pointer local_420;
  EnumDef *local_418;
  CppGenerator *local_410;
  ulong *local_408;
  long local_400;
  ulong local_3f8;
  long lStack_3f0;
  string local_3e8;
  Type *local_3c8;
  iterator iStack_3c0;
  Type *local_3b8;
  long *local_3a8;
  long local_3a0;
  long local_398;
  long lStack_390;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  unsigned_short *local_368;
  iterator iStack_360;
  unsigned_short *local_358;
  StructDef *local_350;
  CodeWriter *local_348;
  long *local_340;
  long local_338;
  long local_330;
  long lStack_328;
  string local_320;
  Type *local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  string local_2d8;
  pointer local_2b8;
  pointer local_2b0;
  Type *local_2a8;
  ulong local_2a0;
  ulong local_298;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_4c8._M_p = (pointer)&aStack_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"NAME","");
  pCVar1 = &this->code_;
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&pCVar1->value_map_,(key_type *)&local_4c8);
  std::__cxx11::string::_M_assign((string *)pmVar21);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_p != &aStack_4b8) {
    operator_delete(local_4c8._M_p,
                    CONCAT62(aStack_4b8._M_allocated_capacity._2_6_,
                             CONCAT11(aStack_4b8._M_local_buf[1],aStack_4b8._M_local_buf[0])) + 1);
  }
  local_4c8._M_p = (pointer)&aStack_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"SEQ_TYPE","");
  if (struct_def == (StructDef *)0x0) {
    pcVar22 = "ST_UNION";
    __s = "ST_ENUM";
    cVar3 = enum_def->is_union;
  }
  else {
    pcVar22 = "ST_STRUCT";
    __s = "ST_TABLE";
    cVar3 = struct_def->fixed;
  }
  if (cVar3 != '\0') {
    __s = pcVar22;
  }
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  sVar23 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,__s,__s + sVar23);
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&pCVar1->value_map_,(key_type *)&local_4c8);
  std::__cxx11::string::_M_assign((string *)pmVar21);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,
                    CONCAT71(local_488.field_2._M_allocated_capacity._1_7_,
                             local_488.field_2._M_local_buf[0]) + 1);
  }
  local_410 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_p != &aStack_4b8) {
    operator_delete(local_4c8._M_p,
                    CONCAT62(aStack_4b8._M_allocated_capacity._2_6_,
                             CONCAT11(aStack_4b8._M_local_buf[1],aStack_4b8._M_local_buf[0])) + 1);
  }
  pSVar11 = (SymbolTable<flatbuffers::EnumVal> *)&struct_def->fields;
  pSVar12 = (SymbolTable<flatbuffers::EnumVal> *)&struct_def->fields;
  if (struct_def == (StructDef *)0x0) {
    pSVar11 = &enum_def->vals;
    pSVar12 = &enum_def->vals;
  }
  ppEVar39 = (pSVar12->vec).
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppEVar5 = (pSVar11->vec).
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_4c8._M_p = (pointer)&aStack_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"NUM_FIELDS","");
  NumToString<unsigned_long>(&local_488,(long)ppEVar39 - (long)ppEVar5 >> 3);
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&pCVar1->value_map_,(key_type *)&local_4c8);
  std::__cxx11::string::_M_assign((string *)pmVar21);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,
                    CONCAT71(local_488.field_2._M_allocated_capacity._1_7_,
                             local_488.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_p != &aStack_4b8) {
    operator_delete(local_4c8._M_p,
                    CONCAT62(aStack_4b8._M_allocated_capacity._2_6_,
                             CONCAT11(aStack_4b8._M_local_buf[1],aStack_4b8._M_local_buf[0])) + 1);
  }
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3b8 = (Type *)0x0;
  local_3c8 = (Type *)0x0;
  iStack_3c0._M_current = (Type *)0x0;
  local_418 = enum_def;
  local_350 = struct_def;
  local_348 = pCVar1;
  local_2b8 = ppEVar5;
  local_2b0 = ppEVar39;
  if (struct_def == (StructDef *)0x0) {
    ppEVar39 = (enum_def->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppEVar39 !=
        (enum_def->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pEVar26 = *ppEVar39;
        EscapeKeyword((string *)&local_4c8,local_410,&pEVar26->name);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_p != &aStack_4b8) {
          operator_delete(local_4c8._M_p,
                          CONCAT62(aStack_4b8._M_allocated_capacity._2_6_,
                                   CONCAT11(aStack_4b8._M_local_buf[1],aStack_4b8._M_local_buf[0]))
                          + 1);
        }
        pTVar36 = &pEVar26->union_type;
        if (local_418->is_union == false) {
          pTVar36 = &enum_def->underlying_type;
        }
        local_4c8._M_p = *(pointer *)pTVar36;
        pSVar38 = pTVar36->struct_def;
        uVar34 = *(undefined8 *)((long)&pTVar36->struct_def + 2);
        uVar10 = *(undefined8 *)((long)&pTVar36->enum_def + 2);
        aStack_4b8._M_local_buf[0] = (char)((ulong)uVar34 >> 0x30);
        aStack_4b8._M_local_buf[1] = (char)((ulong)uVar34 >> 0x38);
        aStack_4b8._M_allocated_capacity._2_6_ = (undefined6)uVar10;
        aStack_4b8._8_2_ = (undefined2)((ulong)uVar10 >> 0x30);
        uStack_4c0 = SUB82(pSVar38,0);
        uStack_4be = (undefined6)((ulong)pSVar38 >> 0x10);
        if (iStack_3c0._M_current == local_3b8) {
          std::vector<flatbuffers::Type,std::allocator<flatbuffers::Type>>::
          _M_realloc_insert<flatbuffers::Type_const&>
                    ((vector<flatbuffers::Type,std::allocator<flatbuffers::Type>> *)&local_3c8,
                     iStack_3c0,(Type *)&local_4c8);
        }
        else {
          (iStack_3c0._M_current)->enum_def =
               (EnumDef *)
               CONCAT62(aStack_4b8._M_allocated_capacity._2_6_,(short)((ulong)uVar34 >> 0x30));
          *(ulong *)&(iStack_3c0._M_current)->fixed_length =
               CONCAT62(aStack_4b8._10_6_,aStack_4b8._8_2_);
          *(pointer *)iStack_3c0._M_current = local_4c8._M_p;
          (iStack_3c0._M_current)->struct_def = pSVar38;
          iStack_3c0._M_current = iStack_3c0._M_current + 1;
        }
        ppEVar39 = ppEVar39 + 1;
      } while (ppEVar39 !=
               (local_418->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
    ppFVar35 = (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar6 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar35 != ppFVar6) {
      do {
        Name_abi_cxx11_((string *)&local_4c8,local_410,*ppFVar35);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8,
                   (string *)&local_4c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_p != &aStack_4b8) {
          operator_delete(local_4c8._M_p,
                          CONCAT62(aStack_4b8._M_allocated_capacity._2_6_,
                                   CONCAT11(aStack_4b8._M_local_buf[1],aStack_4b8._M_local_buf[0]))
                          + 1);
        }
        pFVar7 = *ppFVar35;
        __args = &pFVar7->value;
        if (iStack_3c0._M_current == local_3b8) {
          std::vector<flatbuffers::Type,std::allocator<flatbuffers::Type>>::
          _M_realloc_insert<flatbuffers::Type_const&>
                    ((vector<flatbuffers::Type,std::allocator<flatbuffers::Type>> *)&local_3c8,
                     iStack_3c0,&__args->type);
        }
        else {
          BVar4 = (__args->type).base_type;
          BVar15 = (__args->type).element;
          pSVar38 = (pFVar7->value).type.struct_def;
          uVar13 = (pFVar7->value).type.fixed_length;
          uVar14 = *(undefined6 *)&(pFVar7->value).type.field_0x1a;
          (iStack_3c0._M_current)->enum_def = (pFVar7->value).type.enum_def;
          (iStack_3c0._M_current)->fixed_length = uVar13;
          *(undefined6 *)&(iStack_3c0._M_current)->field_0x1a = uVar14;
          (iStack_3c0._M_current)->base_type = BVar4;
          (iStack_3c0._M_current)->element = BVar15;
          (iStack_3c0._M_current)->struct_def = pSVar38;
          iStack_3c0._M_current = iStack_3c0._M_current + 1;
        }
        ppFVar35 = ppFVar35 + 1;
      } while (ppFVar35 != ppFVar6);
    }
  }
  local_4c8._M_p = (pointer)&aStack_4b8;
  uStack_4c0 = 0;
  uStack_4be = 0;
  aStack_4b8._M_local_buf[0] = '\0';
  local_388.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_388.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_388.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358 = (unsigned_short *)0x0;
  local_368 = (unsigned_short *)0x0;
  iStack_360._M_current = (unsigned_short *)0x0;
  local_2a8 = iStack_3c0._M_current;
  pTVar36 = local_3c8;
  if (local_3c8 != iStack_3c0._M_current) {
    do {
      if (CONCAT62(uStack_4be,uStack_4c0) != 0) {
        std::__cxx11::string::append((char *)&local_4c8);
      }
      BVar4 = pTVar36->base_type;
      local_298 = (ulong)BVar4;
      local_2a0 = (ulong)(BVar4 - BASE_TYPE_ARRAY < 2 || BVar4 == BASE_TYPE_VECTOR);
      BVar4 = (&pTVar36->base_type)[local_2a0];
      pSVar38 = pTVar36->struct_def;
      local_300 = pTVar36;
      if (pSVar38 == (StructDef *)0x0) {
        pEVar8 = pTVar36->enum_def;
        if (pEVar8 == (EnumDef *)0x0) {
          local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"");
        }
        else {
          local_420 = (pointer)CONCAT71(local_420._1_7_,pEVar8 != (EnumDef *)0x0);
          local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
          BaseGenerator::WrapInNameSpace
                    (&local_488,&local_410->super_BaseGenerator,&pEVar8->super_Definition,&local_4a8
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
            operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"");
        BaseGenerator::WrapInNameSpace
                  (&local_488,&local_410->super_BaseGenerator,&pSVar38->super_Definition,&local_2d8)
        ;
      }
      if ((pSVar38 != (StructDef *)0x0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2)) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      pbVar17 = local_388.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      sVar16 = local_488._M_string_length;
      __s2._M_p = local_488._M_dataplus._M_p;
      if (local_488._M_string_length == 0) {
        t = -1;
      }
      else {
        local_420 = local_388.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        pbVar32 = local_388.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_388.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_388.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          t = 0;
          do {
            sVar23 = pbVar32->_M_string_length;
            if ((sVar23 == sVar16) &&
               ((sVar23 == 0 ||
                (iVar20 = bcmp((pbVar32->_M_dataplus)._M_p,__s2._M_p,sVar23), iVar20 == 0))))
            goto LAB_00178cd8;
            pbVar32 = pbVar32 + 1;
            t = t + 1;
          } while (pbVar32 != pbVar17);
        }
        t = -1;
LAB_00178cd8:
        if (pbVar32 == pbVar17) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_388,&local_488);
          t = (int)((ulong)((long)pbVar17 - (long)local_420) >> 5);
        }
      }
      if ((int)local_298 == 0x11) {
        if (iStack_360._M_current == local_358) {
          std::vector<unsigned_short,std::allocator<unsigned_short>>::
          _M_realloc_insert<unsigned_short_const&>
                    ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_368,iStack_360,
                     &local_300->fixed_length);
        }
        else {
          *iStack_360._M_current = local_300->fixed_length;
          iStack_360._M_current = iStack_360._M_current + 1;
        }
      }
      uVar31 = BVar4 - BASE_TYPE_UTYPE;
      if (0xc < uVar31) {
        uVar31 = 0xd;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_340,
                 *(char **)(ElementaryTypeNames()::names + (long)(int)uVar31 * 8),&local_421);
      plVar24 = (long *)std::__cxx11::string::replace((ulong)&local_340,0,(char *)0x0,0x36c18b);
      plVar28 = plVar24 + 2;
      if ((long *)*plVar24 == plVar28) {
        local_398 = *plVar28;
        lStack_390 = plVar24[3];
        local_3a8 = &local_398;
      }
      else {
        local_398 = *plVar28;
        local_3a8 = (long *)*plVar24;
      }
      local_3a0 = plVar24[1];
      *plVar24 = (long)plVar28;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      plVar24 = (long *)std::__cxx11::string::append((char *)&local_3a8);
      puVar29 = (ulong *)(plVar24 + 2);
      if ((ulong *)*plVar24 == puVar29) {
        local_3f8 = *puVar29;
        lStack_3f0 = plVar24[3];
        local_408 = &local_3f8;
      }
      else {
        local_3f8 = *puVar29;
        local_408 = (ulong *)*plVar24;
      }
      local_400 = plVar24[1];
      *plVar24 = (long)puVar29;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      NumToString<bool>(&local_3e8,SUB81(local_2a0,0));
      uVar33 = 0xf;
      if (local_408 != &local_3f8) {
        uVar33 = local_3f8;
      }
      if (uVar33 < local_3e8._M_string_length + local_400) {
        uVar34 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          uVar34 = local_3e8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar34 < local_3e8._M_string_length + local_400) goto LAB_00178f4d;
        puVar25 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,(ulong)local_408);
      }
      else {
LAB_00178f4d:
        puVar25 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_408,(ulong)local_3e8._M_dataplus._M_p);
      }
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      psVar30 = puVar25 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar25 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar30) {
        local_4e8.field_2._M_allocated_capacity = *psVar30;
        local_4e8.field_2._8_8_ = puVar25[3];
      }
      else {
        local_4e8.field_2._M_allocated_capacity = *psVar30;
        local_4e8._M_dataplus._M_p = (pointer)*puVar25;
      }
      local_4e8._M_string_length = puVar25[1];
      *puVar25 = psVar30;
      puVar25[1] = 0;
      *(undefined1 *)psVar30 = 0;
      plVar24 = (long *)std::__cxx11::string::append((char *)&local_4e8);
      local_468 = &local_458;
      puVar29 = (ulong *)(plVar24 + 2);
      if ((ulong *)*plVar24 == puVar29) {
        local_458 = *puVar29;
        lStack_450 = plVar24[3];
      }
      else {
        local_458 = *puVar29;
        local_468 = (ulong *)*plVar24;
      }
      local_460 = plVar24[1];
      *plVar24 = (long)puVar29;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      NumToString<int>(&local_320,t);
      uVar33 = 0xf;
      if (local_468 != &local_458) {
        uVar33 = local_458;
      }
      if (uVar33 < local_320._M_string_length + local_460) {
        uVar34 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          uVar34 = local_320.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar34 < local_320._M_string_length + local_460) goto LAB_00179093;
        puVar25 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_320,0,(char *)0x0,(ulong)local_468);
      }
      else {
LAB_00179093:
        puVar25 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_468,(ulong)local_320._M_dataplus._M_p);
      }
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      puVar29 = puVar25 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar25 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar29) {
        local_448.field_2._M_allocated_capacity = *puVar29;
        local_448.field_2._8_8_ = puVar25[3];
      }
      else {
        local_448.field_2._M_allocated_capacity = *puVar29;
        local_448._M_dataplus._M_p = (pointer)*puVar25;
      }
      local_448._M_string_length = puVar25[1];
      *puVar25 = puVar29;
      puVar25[1] = 0;
      *(undefined1 *)puVar29 = 0;
      plVar24 = (long *)std::__cxx11::string::append((char *)&local_448);
      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
      puVar29 = (ulong *)(plVar24 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar24 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar29) {
        local_4a8.field_2._M_allocated_capacity = *puVar29;
        local_4a8.field_2._8_8_ = plVar24[3];
      }
      else {
        local_4a8.field_2._M_allocated_capacity = *puVar29;
        local_4a8._M_dataplus._M_p = (pointer)*plVar24;
      }
      local_4a8._M_string_length = plVar24[1];
      *plVar24 = (long)puVar29;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_4c8,(ulong)local_4a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      if (local_468 != &local_458) {
        operator_delete(local_468,local_458 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      if (local_408 != &local_3f8) {
        operator_delete(local_408,local_3f8 + 1);
      }
      pTVar19 = local_300;
      if (local_3a8 != &local_398) {
        operator_delete(local_3a8,local_398 + 1);
      }
      if (local_340 != &local_330) {
        operator_delete(local_340,local_330 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,
                        CONCAT71(local_488.field_2._M_allocated_capacity._1_7_,
                                 local_488.field_2._M_local_buf[0]) + 1);
      }
      pTVar36 = pTVar19 + 1;
    } while (pTVar19 + 1 != local_2a8);
  }
  pbVar17 = local_388.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  local_488._M_string_length = 0;
  local_488.field_2._M_local_buf[0] = '\0';
  if (local_388.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_388.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar32 = local_388.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_488._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_488);
      }
      pcVar9 = (pbVar32->_M_dataplus)._M_p;
      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4a8,pcVar9,pcVar9 + pbVar32->_M_string_length);
      std::__cxx11::string::append((char *)&local_4a8);
      std::__cxx11::string::_M_append((char *)&local_488,(ulong)local_4a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
      }
      pbVar32 = pbVar32 + 1;
    } while (pbVar32 != pbVar17);
  }
  iVar18._M_current = iStack_360._M_current;
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  local_4a8._M_string_length = 0;
  local_4a8.field_2._M_allocated_capacity =
       local_4a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (local_368 != iStack_360._M_current) {
    puVar37 = local_368;
    do {
      NumToString<unsigned_short>(&local_448,*puVar37);
      std::__cxx11::string::_M_append((char *)&local_4a8,(ulong)local_448._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_4a8);
      puVar37 = puVar37 + 1;
    } while (puVar37 != iVar18._M_current);
  }
  pbVar17 = local_2f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  local_448._M_string_length = 0;
  local_448.field_2._M_allocated_capacity =
       local_448.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (local_2f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar32 = local_2f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_448._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_448);
      }
      std::operator+(&local_4e8,"\"",pbVar32);
      plVar24 = (long *)std::__cxx11::string::append((char *)&local_4e8);
      puVar29 = (ulong *)(plVar24 + 2);
      if ((ulong *)*plVar24 == puVar29) {
        local_458 = *puVar29;
        lStack_450 = plVar24[3];
        local_468 = &local_458;
      }
      else {
        local_458 = *puVar29;
        local_468 = (ulong *)*plVar24;
      }
      local_460 = plVar24[1];
      *plVar24 = (long)puVar29;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_448,(ulong)local_468);
      if (local_468 != &local_458) {
        operator_delete(local_468,local_458 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
      }
      pbVar32 = pbVar32 + 1;
    } while (pbVar32 != pbVar17);
  }
  pEVar8 = local_418;
  local_468 = &local_458;
  local_460 = 0;
  local_458 = local_458 & 0xffffffffffffff00;
  if (local_418 == (EnumDef *)0x0) {
    bVar40 = false;
    pSVar38 = local_350;
  }
  else {
    pEVar26 = EnumDef::MinValue(local_418);
    pSVar38 = local_350;
    if (pEVar26->value == 0) {
      ppEVar39 = (pEVar8->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar5 = (pEVar8->vals).vec.
                super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      uVar27 = EnumDef::Distance(pEVar8);
      bVar40 = ((long)ppEVar5 - (long)ppEVar39 >> 3) - 1U == uVar27;
    }
    else {
      bVar40 = false;
    }
  }
  this_00 = local_418;
  if ((pEVar8 == (EnumDef *)0x0) || (bVar40)) {
    if ((pSVar38 != (StructDef *)0x0) && (pSVar38->fixed == true)) {
      ppFVar35 = (pSVar38->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar6 = (pSVar38->fields).vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppFVar35 != ppFVar6) {
        do {
          NumToString<unsigned_short>(&local_4e8,((*ppFVar35)->value).offset);
          std::__cxx11::string::_M_append((char *)&local_468,(ulong)local_4e8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
            operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_468);
          ppFVar35 = ppFVar35 + 1;
        } while (ppFVar35 != ppFVar6);
      }
      NumToString<unsigned_long>(&local_4e8,local_350->bytesize);
      std::__cxx11::string::_M_append((char *)&local_468,(ulong)local_4e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    ppEVar39 = (pEVar8->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppEVar39 !=
        (pEVar8->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pEVar26 = *ppEVar39;
        if (local_460 != 0) {
          std::__cxx11::string::append((char *)&local_468);
        }
        EnumDef::ToString_abi_cxx11_(&local_50,this_00,pEVar26);
        NumToStringCpp(&local_4e8,&local_50,(this_00->underlying_type).base_type);
        std::__cxx11::string::_M_append((char *)&local_468,(ulong)local_4e8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        ppEVar39 = ppEVar39 + 1;
      } while (ppEVar39 !=
               (this_00->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  paVar2 = &local_4e8.field_2;
  local_4e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"TYPES","");
  pCVar1 = local_348;
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_348->value_map_,&local_4e8);
  ppEVar5 = local_2b0;
  ppEVar39 = local_2b8;
  std::__cxx11::string::_M_assign((string *)pmVar21);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  local_4e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"REFS","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&pCVar1->value_map_,&local_4e8);
  std::__cxx11::string::_M_assign((string *)pmVar21);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  local_4e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"ARRAYSIZES","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&pCVar1->value_map_,&local_4e8);
  std::__cxx11::string::_M_assign((string *)pmVar21);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  local_4e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"NAMES","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&pCVar1->value_map_,&local_4e8);
  std::__cxx11::string::_M_assign((string *)pmVar21);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  local_4e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"VALUES","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&pCVar1->value_map_,&local_4e8);
  std::__cxx11::string::_M_assign((string *)pmVar21);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"inline const ::flatbuffers::TypeTable *{{NAME}}TypeTable() {","");
  CodeWriter::operator+=(pCVar1,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (ppEVar5 != ppEVar39) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"  static const ::flatbuffers::TypeCode type_codes[] = {","");
    CodeWriter::operator+=(pCVar1,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"    {{TYPES}}","");
    CodeWriter::operator+=(pCVar1,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"  };","");
    CodeWriter::operator+=(pCVar1,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_388.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_388.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"  static const ::flatbuffers::TypeFunction type_refs[] = {","");
    CodeWriter::operator+=(pCVar1,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"    {{REFS}}","");
    CodeWriter::operator+=(pCVar1,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"  };","");
    CodeWriter::operator+=(pCVar1,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_4a8._M_string_length != 0) {
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"  static const int16_t array_sizes[] = { {{ARRAYSIZES}} };","")
    ;
    CodeWriter::operator+=(pCVar1,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_460 != 0) {
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"  static const int64_t values[] = { {{VALUES}} };","");
    CodeWriter::operator+=(pCVar1,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  if ((local_410->opts_).super_IDLOptions.mini_reflect == kTypesAndNames && ppEVar5 != ppEVar39) {
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"  static const char * const names[] = {","");
    CodeWriter::operator+=(pCVar1,&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"    {{NAMES}}","");
    CodeWriter::operator+=(pCVar1,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"  };","");
    CodeWriter::operator+=(pCVar1,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"  static const ::flatbuffers::TypeTable tt = {","");
  CodeWriter::operator+=(pCVar1,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e8,"    ::flatbuffers::{{SEQ_TYPE}}, {{NUM_FIELDS}}, ","");
  plVar24 = (long *)std::__cxx11::string::append((char *)&local_3e8);
  plVar28 = plVar24 + 2;
  if ((long *)*plVar24 == plVar28) {
    local_330 = *plVar28;
    lStack_328 = plVar24[3];
    local_340 = &local_330;
  }
  else {
    local_330 = *plVar28;
    local_340 = (long *)*plVar24;
  }
  local_338 = plVar24[1];
  *plVar24 = (long)plVar28;
  plVar24[1] = 0;
  *(undefined1 *)(plVar24 + 2) = 0;
  plVar24 = (long *)std::__cxx11::string::append((char *)&local_340);
  plVar28 = plVar24 + 2;
  if ((long *)*plVar24 == plVar28) {
    local_398 = *plVar28;
    lStack_390 = plVar24[3];
    local_3a8 = &local_398;
  }
  else {
    local_398 = *plVar28;
    local_3a8 = (long *)*plVar24;
  }
  local_3a0 = plVar24[1];
  *plVar24 = (long)plVar28;
  plVar24[1] = 0;
  *(undefined1 *)(plVar24 + 2) = 0;
  plVar24 = (long *)std::__cxx11::string::append((char *)&local_3a8);
  puVar29 = (ulong *)(plVar24 + 2);
  if ((ulong *)*plVar24 == puVar29) {
    local_3f8 = *puVar29;
    lStack_3f0 = plVar24[3];
    local_408 = &local_3f8;
  }
  else {
    local_3f8 = *puVar29;
    local_408 = (ulong *)*plVar24;
  }
  local_400 = plVar24[1];
  *plVar24 = (long)puVar29;
  plVar24[1] = 0;
  *(undefined1 *)(plVar24 + 2) = 0;
  plVar24 = (long *)std::__cxx11::string::append((char *)&local_408);
  psVar30 = (size_type *)(plVar24 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar24 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar30) {
    local_4e8.field_2._M_allocated_capacity = *psVar30;
    local_4e8.field_2._8_8_ = plVar24[3];
    local_4e8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_4e8.field_2._M_allocated_capacity = *psVar30;
    local_4e8._M_dataplus._M_p = (pointer)*plVar24;
  }
  local_4e8._M_string_length = plVar24[1];
  *plVar24 = (long)psVar30;
  plVar24[1] = 0;
  *(undefined1 *)(plVar24 + 2) = 0;
  plVar24 = (long *)std::__cxx11::string::append((char *)&local_4e8);
  psVar30 = (size_type *)(plVar24 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar24 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar30) {
    local_290.field_2._M_allocated_capacity = *psVar30;
    local_290.field_2._8_8_ = plVar24[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = *psVar30;
    local_290._M_dataplus._M_p = (pointer)*plVar24;
  }
  local_290._M_string_length = plVar24[1];
  *plVar24 = (long)psVar30;
  plVar24[1] = 0;
  *(undefined1 *)(plVar24 + 2) = 0;
  CodeWriter::operator+=(local_348,&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if (local_408 != &local_3f8) {
    operator_delete(local_408,local_3f8 + 1);
  }
  pCVar1 = local_348;
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,local_398 + 1);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340,local_330 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"  };","");
  CodeWriter::operator+=(pCVar1,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"  return &tt;","");
  CodeWriter::operator+=(pCVar1,&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"}","");
  CodeWriter::operator+=(pCVar1,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"");
  CodeWriter::operator+=(pCVar1,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if (local_468 != &local_458) {
    operator_delete(local_468,local_458 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,
                    CONCAT71(local_488.field_2._M_allocated_capacity._1_7_,
                             local_488.field_2._M_local_buf[0]) + 1);
  }
  if (local_368 != (unsigned_short *)0x0) {
    operator_delete(local_368,(long)local_358 - (long)local_368);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_p != &aStack_4b8) {
    operator_delete(local_4c8._M_p,
                    CONCAT62(aStack_4b8._M_allocated_capacity._2_6_,
                             CONCAT11(aStack_4b8._M_local_buf[1],aStack_4b8._M_local_buf[0])) + 1);
  }
  if (local_3c8 != (Type *)0x0) {
    operator_delete(local_3c8,(long)local_3b8 - (long)local_3c8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2f8);
  return;
}

Assistant:

void GenMiniReflect(const StructDef *struct_def, const EnumDef *enum_def) {
    code_.SetValue("NAME", struct_def ? struct_def->name : enum_def->name);
    code_.SetValue("SEQ_TYPE",
                   struct_def ? (struct_def->fixed ? "ST_STRUCT" : "ST_TABLE")
                              : (enum_def->is_union ? "ST_UNION" : "ST_ENUM"));
    auto num_fields =
        struct_def ? struct_def->fields.vec.size() : enum_def->size();
    code_.SetValue("NUM_FIELDS", NumToString(num_fields));
    std::vector<std::string> names;
    std::vector<Type> types;

    if (struct_def) {
      for (const auto &field : struct_def->fields.vec) {
        names.push_back(Name(*field));
        types.push_back(field->value.type);
      }
    } else {
      for (auto it = enum_def->Vals().begin(); it != enum_def->Vals().end();
           ++it) {
        const auto &ev = **it;
        names.push_back(Name(ev));
        types.push_back(enum_def->is_union ? ev.union_type
                                           : Type(enum_def->underlying_type));
      }
    }
    std::string ts;
    std::vector<std::string> type_refs;
    std::vector<uint16_t> array_sizes;
    for (auto &type : types) {
      if (!ts.empty()) ts += ",\n    ";
      auto is_vector = IsVector(type);
      auto is_array = IsArray(type);
      auto bt = is_vector || is_array ? type.element : type.base_type;
      auto et = IsScalar(bt) || bt == BASE_TYPE_STRING
                    ? bt - BASE_TYPE_UTYPE + ET_UTYPE
                    : ET_SEQUENCE;
      int ref_idx = -1;
      std::string ref_name = type.struct_def ? WrapInNameSpace(*type.struct_def)
                             : type.enum_def ? WrapInNameSpace(*type.enum_def)
                                             : "";
      if (!ref_name.empty()) {
        auto rit = type_refs.begin();
        for (; rit != type_refs.end(); ++rit) {
          if (*rit == ref_name) {
            ref_idx = static_cast<int>(rit - type_refs.begin());
            break;
          }
        }
        if (rit == type_refs.end()) {
          ref_idx = static_cast<int>(type_refs.size());
          type_refs.push_back(ref_name);
        }
      }
      if (is_array) { array_sizes.push_back(type.fixed_length); }
      ts += "{ ::flatbuffers::" + std::string(ElementaryTypeNames()[et]) +
            ", " + NumToString(is_vector || is_array) + ", " +
            NumToString(ref_idx) + " }";
    }
    std::string rs;
    for (auto &type_ref : type_refs) {
      if (!rs.empty()) rs += ",\n    ";
      rs += type_ref + "TypeTable";
    }
    std::string as;
    for (auto &array_size : array_sizes) {
      as += NumToString(array_size);
      as += ", ";
    }
    std::string ns;
    for (auto &name : names) {
      if (!ns.empty()) ns += ",\n    ";
      ns += "\"" + name + "\"";
    }
    std::string vs;
    const auto consecutive_enum_from_zero =
        enum_def && enum_def->MinValue()->IsZero() &&
        ((enum_def->size() - 1) == enum_def->Distance());
    if (enum_def && !consecutive_enum_from_zero) {
      for (auto it = enum_def->Vals().begin(); it != enum_def->Vals().end();
           ++it) {
        const auto &ev = **it;
        if (!vs.empty()) vs += ", ";
        vs += NumToStringCpp(enum_def->ToString(ev),
                             enum_def->underlying_type.base_type);
      }
    } else if (struct_def && struct_def->fixed) {
      for (const auto field : struct_def->fields.vec) {
        vs += NumToString(field->value.offset);
        vs += ", ";
      }
      vs += NumToString(struct_def->bytesize);
    }
    code_.SetValue("TYPES", ts);
    code_.SetValue("REFS", rs);
    code_.SetValue("ARRAYSIZES", as);
    code_.SetValue("NAMES", ns);
    code_.SetValue("VALUES", vs);
    code_ += "inline const ::flatbuffers::TypeTable *{{NAME}}TypeTable() {";
    if (num_fields) {
      code_ += "  static const ::flatbuffers::TypeCode type_codes[] = {";
      code_ += "    {{TYPES}}";
      code_ += "  };";
    }
    if (!type_refs.empty()) {
      code_ += "  static const ::flatbuffers::TypeFunction type_refs[] = {";
      code_ += "    {{REFS}}";
      code_ += "  };";
    }
    if (!as.empty()) {
      code_ += "  static const int16_t array_sizes[] = { {{ARRAYSIZES}} };";
    }
    if (!vs.empty()) {
      // Problem with uint64_t values greater than 9223372036854775807ULL.
      code_ += "  static const int64_t values[] = { {{VALUES}} };";
    }
    auto has_names =
        num_fields && opts_.mini_reflect == IDLOptions::kTypesAndNames;
    if (has_names) {
      code_ += "  static const char * const names[] = {";
      code_ += "    {{NAMES}}";
      code_ += "  };";
    }
    code_ += "  static const ::flatbuffers::TypeTable tt = {";
    code_ += std::string("    ::flatbuffers::{{SEQ_TYPE}}, {{NUM_FIELDS}}, ") +
             (num_fields ? "type_codes, " : "nullptr, ") +
             (!type_refs.empty() ? "type_refs, " : "nullptr, ") +
             (!as.empty() ? "array_sizes, " : "nullptr, ") +
             (!vs.empty() ? "values, " : "nullptr, ") +
             (has_names ? "names" : "nullptr");
    code_ += "  };";
    code_ += "  return &tt;";
    code_ += "}";
    code_ += "";
  }